

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseString<0u,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler,bool isKey)

{
  byte bVar1;
  char cVar2;
  char *pcVar3;
  size_t sVar4;
  Ch *pCVar5;
  Ch *pCVar6;
  Stack<rapidjson::CrtAllocator> *pSVar7;
  bool bVar8;
  uint codepoint;
  uint uVar9;
  byte *pbVar10;
  Ch c;
  StackStream<char> stackStream;
  
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
  stackStream.length_ = 0;
  stackStream.stack_ = (Stack<rapidjson::CrtAllocator> *)this;
  do {
    while( true ) {
      pbVar10 = (byte *)is->current_;
      bVar1 = *pbVar10;
      if (bVar1 != 0x5c) break;
      pbVar10 = pbVar10 + (is->count_ - (long)is->buffer_);
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
      cVar2 = ParseStringToStream<0u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>(rapidjson::BasicIStreamWrapper<std::istream>&,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>&)
              ::escape[(byte)*is->current_];
      if (cVar2 == '\0') {
        if (*is->current_ != 0x75) {
          *(undefined4 *)(this + 0x30) = 10;
          goto LAB_00123cc8;
        }
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
        codepoint = ParseHex4<rapidjson::BasicIStreamWrapper<std::istream>>(this,is,(size_t)pbVar10)
        ;
        if (*(int *)(this + 0x30) != 0) goto LAB_00123ccc;
        if ((codepoint & 0xfffff800) == 0xd800) {
          if (((0xdbff < codepoint) || (*is->current_ != '\\')) ||
             (BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is),
             *is->current_ != 'u')) {
            *(undefined4 *)(this + 0x30) = 9;
            goto LAB_00123cc8;
          }
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
          uVar9 = ParseHex4<rapidjson::BasicIStreamWrapper<std::istream>>(this,is,(size_t)pbVar10);
          if (*(int *)(this + 0x30) == 0) {
            if (uVar9 - 0xe000 < 0xfffffc00) {
              *(undefined4 *)(this + 0x30) = 9;
              *(byte **)(this + 0x38) = pbVar10;
              goto LAB_00123c74;
            }
            codepoint = codepoint * 0x400 + uVar9 + 0xfca02400;
            bVar8 = true;
          }
          else {
LAB_00123c74:
            bVar8 = false;
          }
          if (!bVar8) goto LAB_00123ccc;
        }
        UTF8<char>::
        Encode<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
                  (&stackStream,codepoint);
      }
      else {
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
        pSVar7 = stackStream.stack_;
        if ((stackStream.stack_)->stackEnd_ == (stackStream.stack_)->stackTop_ ||
            (long)(stackStream.stack_)->stackEnd_ - (long)(stackStream.stack_)->stackTop_ < 0) {
          internal::Stack<rapidjson::CrtAllocator>::Expand<char>(stackStream.stack_,1);
        }
        pcVar3 = pSVar7->stackTop_;
        pSVar7->stackTop_ = pcVar3 + 1;
        *pcVar3 = cVar2;
        stackStream.length_ = stackStream.length_ + 1;
      }
    }
    if (bVar1 == 0x22) {
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
      pSVar7 = stackStream.stack_;
      if ((stackStream.stack_)->stackEnd_ == (stackStream.stack_)->stackTop_ ||
          (long)(stackStream.stack_)->stackEnd_ - (long)(stackStream.stack_)->stackTop_ < 0) {
        internal::Stack<rapidjson::CrtAllocator>::Expand<char>(stackStream.stack_,1);
      }
      pcVar3 = pSVar7->stackTop_;
      pSVar7->stackTop_ = pcVar3 + 1;
      *pcVar3 = '\0';
      stackStream.length_ = stackStream.length_ + 1;
LAB_00123ccc:
      if (*(int *)(this + 0x30) == 0) {
        pcVar3 = (stackStream.stack_)->stackTop_;
        (stackStream.stack_)->stackTop_ = pcVar3 + -(ulong)stackStream.length_;
        bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::String(handler,pcVar3 + -(ulong)stackStream.length_,stackStream.length_ - 1,true);
        if (!bVar8) {
          sVar4 = is->count_;
          pCVar5 = is->current_;
          pCVar6 = is->buffer_;
          *(undefined4 *)(this + 0x30) = 0x10;
          *(Ch **)(this + 0x38) = pCVar5 + (sVar4 - (long)pCVar6);
        }
      }
      return;
    }
    if (bVar1 < 0x20) {
      pbVar10 = pbVar10 + (is->count_ - (long)is->buffer_);
      if (bVar1 == 0) {
        *(undefined4 *)(this + 0x30) = 0xb;
      }
      else {
        *(undefined4 *)(this + 0x30) = 0xc;
      }
LAB_00123cc8:
      *(byte **)(this + 0x38) = pbVar10;
      goto LAB_00123ccc;
    }
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
    pSVar7 = stackStream.stack_;
    if ((stackStream.stack_)->stackEnd_ == (stackStream.stack_)->stackTop_ ||
        (long)(stackStream.stack_)->stackEnd_ - (long)(stackStream.stack_)->stackTop_ < 0) {
      internal::Stack<rapidjson::CrtAllocator>::Expand<char>(stackStream.stack_,1);
    }
    pbVar10 = (byte *)pSVar7->stackTop_;
    pSVar7->stackTop_ = (char *)(pbVar10 + 1);
    *pbVar10 = bVar1;
    stackStream.length_ = stackStream.length_ + 1;
  } while( true );
}

Assistant:

void ParseString(InputStream& is, Handler& handler, bool isKey = false) {
        internal::StreamLocalCopy<InputStream> copy(is);
        InputStream& s(copy.s);

        RAPIDJSON_ASSERT(s.Peek() == '\"');
        s.Take();  // Skip '\"'

        bool success = false;
        if (parseFlags & kParseInsituFlag) {
            typename InputStream::Ch *head = s.PutBegin();
            ParseStringToStream<parseFlags, SourceEncoding, SourceEncoding>(s, s);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
            size_t length = s.PutEnd(head) - 1;
            RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
            const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
            success = (isKey ? handler.Key(str, SizeType(length), false) : handler.String(str, SizeType(length), false));
        }
        else {
            StackStream<typename TargetEncoding::Ch> stackStream(stack_);
            ParseStringToStream<parseFlags, SourceEncoding, TargetEncoding>(s, stackStream);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
            SizeType length = static_cast<SizeType>(stackStream.Length()) - 1;
            const typename TargetEncoding::Ch* const str = stackStream.Pop();
            success = (isKey ? handler.Key(str, length, true) : handler.String(str, length, true));
        }
        if (RAPIDJSON_UNLIKELY(!success))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, s.Tell());
    }